

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_txt_emit.h
# Opt level: O0

char * sh4asm_disp8_str(uint disp8,uint shift)

{
  uint shift_local;
  uint disp8_local;
  
  snprintf(sh4asm_disp8_str::buf,8,"%d",
           (ulong)(disp8 & (0x100 << ((byte)shift & 0x1f)) - 1U &
                  ((1 << ((byte)shift & 0x1f)) - 1U ^ 0xffffffff)));
  sh4asm_disp8_str::buf[7] = '\0';
  return sh4asm_disp8_str::buf;
}

Assistant:

static char const *sh4asm_disp8_str(unsigned disp8, unsigned shift) {
    // TODO: pad output to two hex digits
    static char buf[8];
    snprintf(buf, sizeof(buf), "%d", //"0x%02x",
             disp8 & ((256 << shift) - 1) & ~((1 << shift)-1));
    buf[7] = '\0';
    return buf;
}